

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O3

CURLcode Curl_fillreadbuffer(connectdata *conn,size_t bytes,size_t *nreadp)

{
  Curl_send_buffer **buffer;
  char **ppcVar1;
  int *piVar2;
  undefined1 *puVar3;
  trailers_state tVar4;
  Curl_easy *data;
  int iVar5;
  CURLcode CVar6;
  trailers_state tVar7;
  Curl_send_buffer *pCVar8;
  size_t sVar9;
  code *pcVar10;
  size_t __n;
  char *pcVar11;
  char *__dest;
  Curl_easy *pCVar12;
  size_t sVar13;
  curl_slist *trailers;
  undefined1 local_48 [7];
  uint uStack_41;
  ulong local_38;
  
  data = conn->data;
  tVar7 = (data->state).trailers_state;
  if (tVar7 == TRAILERS_INITIALIZED) {
    local_48 = (undefined1  [7])0x0;
    uStack_41 = uStack_41 & 0xffffff00;
    Curl_infof(data,"Moving trailers state machine from initialized to sending.\n");
    (data->state).trailers_state = TRAILERS_SENDING;
    pCVar8 = Curl_add_buffer_init();
    (data->state).trailers_buf = pCVar8;
    if (pCVar8 == (Curl_send_buffer *)0x0) {
      Curl_failf(data,"Unable to allocate trailing headers buffer !");
      return CURLE_OUT_OF_MEMORY;
    }
    buffer = &(data->state).trailers_buf;
    (data->state).trailers_bytes_sent = 0;
    Curl_set_in_callback(data,true);
    iVar5 = (*(data->set).trailer_callback)((curl_slist **)local_48,(data->set).trailer_data);
    Curl_set_in_callback(data,false);
    if (iVar5 != 0) {
      Curl_failf(data,"operation aborted by trailing headers callback");
      *nreadp = 0;
      CVar6 = CURLE_ABORTED_BY_CALLBACK;
LAB_00122972:
      Curl_add_buffer_free(buffer);
      curl_slist_free_all((curl_slist *)CONCAT17((undefined1)uStack_41,local_48));
      return CVar6;
    }
    CVar6 = Curl_http_compile_trailers
                      ((curl_slist *)CONCAT17((undefined1)uStack_41,local_48),buffer,data);
    if (CVar6 != CURLE_OK) goto LAB_00122972;
    Curl_infof(data,"Successfully compiled trailers.\r\n");
    curl_slist_free_all((curl_slist *)CONCAT17((undefined1)uStack_41,local_48));
    tVar7 = (data->state).trailers_state;
  }
  if ((tVar7 == TRAILERS_NONE & (byte)(data->req).field_0x570 >> 6) == 1) {
    bytes = bytes - 0xc;
    ppcVar1 = &(data->req).upload_fromhere;
    *ppcVar1 = *ppcVar1 + 10;
LAB_001229e0:
    pcVar10 = (data->state).fread_func;
    pCVar12 = (Curl_easy *)(data->state).in;
  }
  else {
    if (tVar7 != TRAILERS_SENDING) goto LAB_001229e0;
    pcVar10 = Curl_trailers_read;
    pCVar12 = data;
  }
  Curl_set_in_callback(data,true);
  sVar9 = (*pcVar10)((data->req).upload_fromhere,1,bytes,pCVar12);
  Curl_set_in_callback(data,false);
  if (sVar9 == 0x10000001) {
    if ((conn->handler->flags & 0x10) == 0) {
      piVar2 = &(data->req).keepon;
      *(byte *)piVar2 = (byte)*piVar2 | 0x20;
      if (((data->req).field_0x570 & 0x40) != 0) {
        ppcVar1 = &(data->req).upload_fromhere;
        *ppcVar1 = *ppcVar1 + -10;
      }
      *nreadp = 0;
      return CURLE_OK;
    }
    pcVar11 = "Read callback asked for PAUSE when not supported!";
LAB_00122aa3:
    Curl_failf(data,pcVar11);
    return CURLE_READ_ERROR;
  }
  if (sVar9 == 0x10000000) {
    Curl_failf(data,"operation aborted by callback");
    *nreadp = 0;
    return CURLE_ABORTED_BY_CALLBACK;
  }
  if (bytes < sVar9) {
    *nreadp = 0;
    pcVar11 = "read function returned funny value";
    goto LAB_00122aa3;
  }
  if ((*(ushort *)&(data->req).field_0x570 & 0x140) != 0x40) goto LAB_00122c3a;
  local_38 = *(ulong *)&(data->set).field_0x8e8;
  pcVar11 = "\n";
  if ((local_38 & 0x840) == 0) {
    pcVar11 = "\r\n";
  }
  tVar7 = (data->state).trailers_state;
  if (tVar7 == TRAILERS_SENDING) {
    __n = 0;
    sVar13 = sVar9;
LAB_00122b9d:
    if (((data->state).trailers_buf)->size_used == (data->state).trailers_bytes_sent) {
      Curl_add_buffer_free(&(data->state).trailers_buf);
      (data->state).trailers_state = TRAILERS_DONE;
      (data->set).trailer_data = (void *)0x0;
      (data->set).trailer_callback = (curl_trailer_callback)0x0;
      puVar3 = &(data->req).field_0x570;
      *puVar3 = *puVar3 | 4;
      Curl_infof(data,"Signaling end of chunked upload after trailers.\n");
    }
    else if (sVar13 == __n) {
LAB_00122c05:
      puVar3 = &(data->req).field_0x570;
      *puVar3 = *puVar3 | 4;
      Curl_infof(data,"Signaling end of chunked upload via terminating chunk.\n");
      sVar13 = __n;
    }
    sVar9 = sVar13;
    if (tVar7 == TRAILERS_SENDING) goto LAB_00122c3a;
  }
  else {
    local_48 = (undefined1  [7])0x0;
    uStack_41 = 0;
    iVar5 = curl_msnprintf(local_48,0xb,"%zx%s",sVar9,pcVar11);
    __n = (size_t)iVar5;
    __dest = (data->req).upload_fromhere + -__n;
    (data->req).upload_fromhere = __dest;
    sVar13 = sVar9 + __n;
    memcpy(__dest,local_48,__n);
    if (((sVar9 == 0) && ((data->set).trailer_callback != (curl_trailer_callback)0x0)) &&
       ((data->state).trailers_state == TRAILERS_NONE)) {
      (data->state).trailers_state = TRAILERS_INITIALIZED;
      sVar9 = sVar13;
      goto LAB_00122c3a;
    }
    memcpy((data->req).upload_fromhere + sVar13,pcVar11,(ulong)((local_38 & 0x840) == 0) + 1);
    tVar4 = (data->state).trailers_state;
    if (tVar4 == TRAILERS_SENDING) goto LAB_00122b9d;
    if (tVar4 != TRAILERS_INITIALIZED && sVar9 == 0) goto LAB_00122c05;
  }
  sVar9 = sVar13 + 1 + (ulong)((local_38 & 0x840) == 0);
LAB_00122c3a:
  *nreadp = sVar9;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_fillreadbuffer(struct connectdata *conn, size_t bytes,
                             size_t *nreadp)
{
  struct Curl_easy *data = conn->data;
  size_t buffersize = bytes;
  size_t nread;

  curl_read_callback readfunc = NULL;
  void *extra_data = NULL;

#ifdef CURL_DOES_CONVERSIONS
  bool sending_http_headers = FALSE;

  if(conn->handler->protocol&(PROTO_FAMILY_HTTP|CURLPROTO_RTSP)) {
    const struct HTTP *http = data->req.protop;

    if(http->sending == HTTPSEND_REQUEST)
      /* We're sending the HTTP request headers, not the data.
         Remember that so we don't re-translate them into garbage. */
      sending_http_headers = TRUE;
  }
#endif

#ifndef CURL_DISABLE_HTTP
  if(data->state.trailers_state == TRAILERS_INITIALIZED) {
    struct curl_slist *trailers = NULL;
    CURLcode result;
    int trailers_ret_code;

    /* at this point we already verified that the callback exists
       so we compile and store the trailers buffer, then proceed */
    infof(data,
          "Moving trailers state machine from initialized to sending.\n");
    data->state.trailers_state = TRAILERS_SENDING;
    data->state.trailers_buf = Curl_add_buffer_init();
    if(!data->state.trailers_buf) {
      failf(data, "Unable to allocate trailing headers buffer !");
      return CURLE_OUT_OF_MEMORY;
    }
    data->state.trailers_bytes_sent = 0;
    Curl_set_in_callback(data, true);
    trailers_ret_code = data->set.trailer_callback(&trailers,
                                                   data->set.trailer_data);
    Curl_set_in_callback(data, false);
    if(trailers_ret_code == CURL_TRAILERFUNC_OK) {
      result = Curl_http_compile_trailers(trailers, &data->state.trailers_buf,
                                          data);
    }
    else {
      failf(data, "operation aborted by trailing headers callback");
      *nreadp = 0;
      result = CURLE_ABORTED_BY_CALLBACK;
    }
    if(result) {
      Curl_add_buffer_free(&data->state.trailers_buf);
      curl_slist_free_all(trailers);
      return result;
    }
    infof(data, "Successfully compiled trailers.\r\n");
    curl_slist_free_all(trailers);
  }
#endif

  /* if we are transmitting trailing data, we don't need to write
     a chunk size so we skip this */
  if(data->req.upload_chunky &&
     data->state.trailers_state == TRAILERS_NONE) {
    /* if chunked Transfer-Encoding */
    buffersize -= (8 + 2 + 2);   /* 32bit hex + CRLF + CRLF */
    data->req.upload_fromhere += (8 + 2); /* 32bit hex + CRLF */
  }

#ifndef CURL_DISABLE_HTTP
  if(data->state.trailers_state == TRAILERS_SENDING) {
    /* if we're here then that means that we already sent the last empty chunk
       but we didn't send a final CR LF, so we sent 0 CR LF. We then start
       pulling trailing data until we have no more at which point we
       simply return to the previous point in the state machine as if
       nothing happened.
       */
    readfunc = Curl_trailers_read;
    extra_data = (void *)data;
  }
  else
#endif
  {
    readfunc = data->state.fread_func;
    extra_data = data->state.in;
  }

  Curl_set_in_callback(data, true);
  nread = readfunc(data->req.upload_fromhere, 1,
                   buffersize, extra_data);
  Curl_set_in_callback(data, false);

  if(nread == CURL_READFUNC_ABORT) {
    failf(data, "operation aborted by callback");
    *nreadp = 0;
    return CURLE_ABORTED_BY_CALLBACK;
  }
  if(nread == CURL_READFUNC_PAUSE) {
    struct SingleRequest *k = &data->req;

    if(conn->handler->flags & PROTOPT_NONETWORK) {
      /* protocols that work without network cannot be paused. This is
         actually only FILE:// just now, and it can't pause since the transfer
         isn't done using the "normal" procedure. */
      failf(data, "Read callback asked for PAUSE when not supported!");
      return CURLE_READ_ERROR;
    }

    /* CURL_READFUNC_PAUSE pauses read callbacks that feed socket writes */
    k->keepon |= KEEP_SEND_PAUSE; /* mark socket send as paused */
    if(data->req.upload_chunky) {
        /* Back out the preallocation done above */
      data->req.upload_fromhere -= (8 + 2);
    }
    *nreadp = 0;

    return CURLE_OK; /* nothing was read */
  }
  else if(nread > buffersize) {
    /* the read function returned a too large value */
    *nreadp = 0;
    failf(data, "read function returned funny value");
    return CURLE_READ_ERROR;
  }

  if(!data->req.forbidchunk && data->req.upload_chunky) {
    /* if chunked Transfer-Encoding
     *    build chunk:
     *
     *        <HEX SIZE> CRLF
     *        <DATA> CRLF
     */
    /* On non-ASCII platforms the <DATA> may or may not be
       translated based on set.prefer_ascii while the protocol
       portion must always be translated to the network encoding.
       To further complicate matters, line end conversion might be
       done later on, so we need to prevent CRLFs from becoming
       CRCRLFs if that's the case.  To do this we use bare LFs
       here, knowing they'll become CRLFs later on.
     */

    bool added_crlf = FALSE;
    int hexlen = 0;
    const char *endofline_native;
    const char *endofline_network;

    if(
#ifdef CURL_DO_LINEEND_CONV
       (data->set.prefer_ascii) ||
#endif
       (data->set.crlf)) {
      /* \n will become \r\n later on */
      endofline_native  = "\n";
      endofline_network = "\x0a";
    }
    else {
      endofline_native  = "\r\n";
      endofline_network = "\x0d\x0a";
    }

    /* if we're not handling trailing data, proceed as usual */
    if(data->state.trailers_state != TRAILERS_SENDING) {
      char hexbuffer[11] = "";
      hexlen = msnprintf(hexbuffer, sizeof(hexbuffer),
                         "%zx%s", nread, endofline_native);

      /* move buffer pointer */
      data->req.upload_fromhere -= hexlen;
      nread += hexlen;

      /* copy the prefix to the buffer, leaving out the NUL */
      memcpy(data->req.upload_fromhere, hexbuffer, hexlen);

      /* always append ASCII CRLF to the data unless
         we have a valid trailer callback */
#ifndef CURL_DISABLE_HTTP
      if((nread-hexlen) == 0 &&
          data->set.trailer_callback != NULL &&
          data->state.trailers_state == TRAILERS_NONE) {
        data->state.trailers_state = TRAILERS_INITIALIZED;
      }
      else
#endif
      {
        memcpy(data->req.upload_fromhere + nread,
               endofline_network,
               strlen(endofline_network));
        added_crlf = TRUE;
      }
    }

#ifdef CURL_DOES_CONVERSIONS
    {
      CURLcode result;
      size_t length;
      if(data->set.prefer_ascii)
        /* translate the protocol and data */
        length = nread;
      else
        /* just translate the protocol portion */
        length = hexlen;
      if(length) {
        result = Curl_convert_to_network(data, data->req.upload_fromhere,
                                         length);
        /* Curl_convert_to_network calls failf if unsuccessful */
        if(result)
          return result;
      }
    }
#endif /* CURL_DOES_CONVERSIONS */

#ifndef CURL_DISABLE_HTTP
    if(data->state.trailers_state == TRAILERS_SENDING &&
       !Curl_trailers_left(data)) {
      Curl_add_buffer_free(&data->state.trailers_buf);
      data->state.trailers_state = TRAILERS_DONE;
      data->set.trailer_data = NULL;
      data->set.trailer_callback = NULL;
      /* mark the transfer as done */
      data->req.upload_done = TRUE;
      infof(data, "Signaling end of chunked upload after trailers.\n");
    }
    else
#endif
      if((nread - hexlen) == 0 &&
         data->state.trailers_state != TRAILERS_INITIALIZED) {
        /* mark this as done once this chunk is transferred */
        data->req.upload_done = TRUE;
        infof(data,
              "Signaling end of chunked upload via terminating chunk.\n");
      }

    if(added_crlf)
      nread += strlen(endofline_network); /* for the added end of line */
  }
#ifdef CURL_DOES_CONVERSIONS
  else if((data->set.prefer_ascii) && (!sending_http_headers)) {
    CURLcode result;
    result = Curl_convert_to_network(data, data->req.upload_fromhere, nread);
    /* Curl_convert_to_network calls failf if unsuccessful */
    if(result)
      return result;
  }
#endif /* CURL_DOES_CONVERSIONS */

  *nreadp = nread;

  return CURLE_OK;
}